

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

undefined8 GetNonDefaultString<unsigned_long>(char *name,unsigned_long *value)

{
  ostream *poVar1;
  ulong *in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  ostringstream ss;
  ostringstream local_190 [376];
  ulong *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,std::boolalpha);
  poVar1 = std::operator<<((ostream *)local_190,"Control ");
  poVar1 = std::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1," is set to non-default value: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_18);
  std::operator<<(poVar1,"\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

static std::string GetNonDefaultString(
    const char* name,
    const T& value )
{
    std::ostringstream ss;
    ss << std::boolalpha;
    ss << "Control " << name << " is set to non-default value: " << value << "\n";
    return ss.str();
}